

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestProgramEnd(StreamingListener *this,UnitTest *unit_test)

{
  bool bVar1;
  string local_48;
  String local_28;
  
  bVar1 = UnitTest::Passed(unit_test);
  String::Format(&local_28,"event=TestProgramEnd&passed=%d\n",(ulong)bVar1);
  String::operator_cast_to_string(&local_48,&local_28);
  Send(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  String::~String(&local_28);
  CloseConnection(this);
  return;
}

Assistant:

void OnTestProgramEnd(const UnitTest& unit_test) {
    // Note that Google Test current only report elapsed time for each
    // test iteration, not for the entire test program.
    Send(String::Format("event=TestProgramEnd&passed=%d\n",
                        unit_test.Passed()));

    // Notify the streaming server to stop.
    CloseConnection();
  }